

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiArea::childEvent(QMdiArea *this,QChildEvent *childEvent)

{
  QMdiAreaPrivate *this_00;
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  QMdiSubWindow *child;
  long lVar4;
  QMdiSubWindow *pQVar5;
  
  if (*(short *)(childEvent + 8) == 0x45) {
    this_00 = *(QMdiAreaPrivate **)
               &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    child = (QMdiSubWindow *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
    if (child != (QMdiSubWindow *)0x0) {
      lVar1 = (this_00->childWindows).d.size;
      if (lVar1 != 0) {
        pQVar2 = (this_00->childWindows).d.ptr;
        lVar4 = 0;
        do {
          if (lVar1 << 4 == lVar4) goto LAB_004429c4;
          lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar4);
          if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
            pQVar5 = (QMdiSubWindow *)0x0;
          }
          else {
            pQVar5 = *(QMdiSubWindow **)((long)&(pQVar2->wp).value + lVar4);
          }
          lVar4 = lVar4 + 0x10;
        } while (pQVar5 != child);
        if (lVar4 != 0) {
          return;
        }
      }
LAB_004429c4:
      QMdiAreaPrivate::appendChild(this_00,child);
      return;
    }
  }
  return;
}

Assistant:

void QMdiArea::childEvent(QChildEvent *childEvent)
{
    Q_D(QMdiArea);
    if (childEvent->type() == QEvent::ChildPolished) {
        if (QMdiSubWindow *mdiChild = qobject_cast<QMdiSubWindow *>(childEvent->child())) {
            if (d->childWindows.indexOf(mdiChild) == -1)
                d->appendChild(mdiChild);
        }
    }
}